

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O0

void __thiscall
spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass
          (RegionRegisterLiveness *this,Instruction *insn)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  TypeManager *this_00;
  DecorationManager *this_01;
  anon_class_8_1_084c8cad local_58;
  function<bool_(const_spvtools::opt::Instruction_&)> local_50;
  undefined1 local_30 [8];
  RegisterClass reg_class;
  Type *type;
  Instruction *insn_local;
  RegionRegisterLiveness *this_local;
  
  bVar1 = anon_unknown_8::CreatesRegisterUsage(insn);
  if (!bVar1) {
    __assert_fail("CreatesRegisterUsage(insn) && \"Instruction does not use a register\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                  ,0x10a,
                  "void spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(Instruction *)"
                 );
  }
  pIVar3 = opt::Instruction::context(insn);
  this_00 = IRContext::get_type_mgr(pIVar3);
  uVar2 = opt::Instruction::type_id(insn);
  local_30 = (undefined1  [8])analysis::TypeManager::GetType(this_00,uVar2);
  reg_class.type_._0_1_ = 0;
  reg_class._8_8_ = local_30;
  pIVar3 = opt::Instruction::context(insn);
  this_01 = IRContext::get_decoration_mgr(pIVar3);
  uVar2 = opt::Instruction::result_id(insn);
  local_58.reg_class = (RegisterClass *)local_30;
  std::function<bool(spvtools::opt::Instruction_const&)>::
  function<spvtools::opt::RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(spvtools::opt::Instruction*)::__0,void>
            ((function<bool(spvtools::opt::Instruction_const&)> *)&local_50,&local_58);
  analysis::DecorationManager::WhileEachDecoration(this_01,uVar2,0x1a,&local_50);
  std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_50);
  AddRegisterClass(this,(RegisterClass *)local_30);
  return;
}

Assistant:

void RegisterLiveness::RegionRegisterLiveness::AddRegisterClass(
    Instruction* insn) {
  assert(CreatesRegisterUsage(insn) && "Instruction does not use a register");
  analysis::Type* type =
      insn->context()->get_type_mgr()->GetType(insn->type_id());

  RegisterLiveness::RegisterClass reg_class{type, false};

  insn->context()->get_decoration_mgr()->WhileEachDecoration(
      insn->result_id(), uint32_t(spv::Decoration::Uniform),
      [&reg_class](const Instruction&) {
        reg_class.is_uniform_ = true;
        return false;
      });

  AddRegisterClass(reg_class);
}